

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::
call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
::
call_matcher<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>
          (call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
           *this,char *file,unsigned_long line,char *call_string,
          predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
          *u)

{
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  local_48;
  location local_40;
  predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
  *local_30;
  predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
  *u_local;
  char *call_string_local;
  unsigned_long line_local;
  char *file_local;
  call_matcher<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>_>_>
  *this_local;
  
  local_30 = u;
  u_local = (predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
             *)call_string;
  call_string_local = (char *)line;
  line_local = (unsigned_long)file;
  file_local = (char *)this;
  location::location(&local_40,file,line);
  call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>::call_matcher_base
            ((call_matcher_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *)this
             ,local_40,(char *)u_local);
  expectation::expectation((expectation *)(this + 0x30));
  *(undefined ***)this = &PTR__call_matcher_007bf3c8;
  *(undefined **)(this + 0x30) = &DAT_007bf430;
  list<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::delete_disposer>
  ::list((list<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::delete_disposer>
          *)(this + 0x38));
  list<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::delete_disposer>
  ::list((list<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>,_trompeloeil::delete_disposer>
          *)(this + 0x50));
  std::
  unique_ptr<trompeloeil::return_handler<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>,std::default_delete<trompeloeil::return_handler<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>>>
  ::
  unique_ptr<std::default_delete<trompeloeil::return_handler<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>>,void>
            ((unique_ptr<trompeloeil::return_handler<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>,std::default_delete<trompeloeil::return_handler<std::reference_wrapper<int>&(std::reference_wrapper<int>&)>>>
              *)(this + 0x68));
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  std::
  unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
  ::
  unique_ptr<trompeloeil::sequence_handler<0ul>,std::default_delete<trompeloeil::sequence_handler<0ul>>,void>
            ((unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
              *)(this + 0x70),&local_48);
  std::
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  ::~unique_ptr(&local_48);
  std::
  tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>_>
  ::
  tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>,_true,_true>
            ((tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>_>
              *)(this + 0x78),local_30);
  this[0x7c] = (call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
                )0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}